

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

void * alsa_run_thread(void *context)

{
  snd_pcm_uframes_t *psVar1;
  pthread_mutex_t *__mutex;
  __suseconds_t *p_Var2;
  long lVar3;
  cubeb_stream_conflict1 *pcVar4;
  char *pcVar5;
  pollfd *ppVar6;
  int iVar7;
  int iVar8;
  snd_pcm_stream_t sVar9;
  snd_pcm_state_t sVar10;
  long lVar11;
  undefined4 *puVar12;
  ulong uVar13;
  snd_pcm_uframes_t sVar14;
  snd_pcm_uframes_t sVar15;
  snd_pcm_uframes_t sVar16;
  ssize_t sVar17;
  snd_pcm_uframes_t sVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  nfds_t i;
  nfds_t nVar22;
  cubeb_state cVar23;
  long lVar24;
  cubeb_stream_conflict1 *pcVar25;
  stream_state sVar26;
  long drain_frames;
  pthread_mutex_t *__mutex_00;
  size_t sVar27;
  char *local_50;
  undefined1 local_41;
  pthread_mutex_t *local_40;
  unsigned_short local_32;
  
  __mutex_00 = (pthread_mutex_t *)((long)context + 0x18);
  local_40 = __mutex_00;
  do {
    pthread_mutex_lock(__mutex_00);
    if (*(int *)((long)context + 0xd0) != 0) {
      sVar27 = 1;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        lVar24 = *(long *)((long)context + lVar11 * 8 + 0x40);
        if ((lVar24 != 0) && (*(undefined8 *)(lVar24 + 0xc0) = 0, *(int *)(lVar24 + 0xb0) == 1)) {
          sVar27 = sVar27 + *(long *)(lVar24 + 200);
        }
      }
      free(*(void **)((long)context + 0xc0));
      puVar12 = (undefined4 *)calloc(sVar27,8);
      *(undefined4 **)((long)context + 0xc0) = puVar12;
      if (puVar12 == (undefined4 *)0x0) {
        __assert_fail("ctx->fds",
                      "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                      ,0x103,"void rebuild(cubeb *)");
      }
      *(size_t *)((long)context + 200) = sVar27;
      *puVar12 = *(undefined4 *)((long)context + 0xd8);
      *(undefined2 *)(puVar12 + 1) = 9;
      lVar11 = 1;
      for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
        lVar3 = *(long *)((long)context + lVar24 * 8 + 0x40);
        if ((lVar3 != 0) && (*(int *)(lVar3 + 0xb0) == 1)) {
          memcpy(puVar12 + lVar11 * 2,*(void **)(lVar3 + 0xb8),*(long *)(lVar3 + 200) << 3);
          puVar12 = *(undefined4 **)((long)context + 0xc0);
          *(undefined4 **)(lVar3 + 0xc0) = puVar12 + lVar11 * 2;
          lVar11 = lVar11 + *(long *)(lVar3 + 200);
        }
      }
      *(undefined4 *)((long)context + 0xd0) = 0;
    }
    iVar8 = 1000;
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      lVar24 = *(long *)((long)context + lVar11 * 8 + 0x40);
      if ((lVar24 != 0) && (*(int *)(lVar24 + 0xb0) == 2)) {
        iVar7 = timeval_to_relative_ms((timeval *)(lVar24 + 0xd0));
        iVar19 = iVar7;
        if (iVar8 < iVar7) {
          iVar19 = iVar8;
        }
        if (-1 < iVar7) {
          iVar8 = iVar19;
        }
      }
    }
    pthread_mutex_unlock(__mutex_00);
    iVar8 = poll(*(pollfd **)((long)context + 0xc0),*(nfds_t *)((long)context + 200),iVar8);
    pthread_mutex_lock(__mutex_00);
    if (iVar8 < 1) {
      if (iVar8 == 0) {
        for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
          pcVar4 = *(cubeb_stream_conflict1 **)((long)context + lVar11 * 8 + 0x40);
          if (pcVar4 != (cubeb_stream_conflict1 *)0x0) {
            sVar26 = pcVar4->state;
            if (sVar26 == DRAINING) {
              iVar8 = ms_since(&pcVar4->drain_timeout);
              sVar26 = INACTIVE;
              cVar23 = CUBEB_STATE_DRAINED;
              if (iVar8 < 0) {
                sVar26 = pcVar4->state;
                goto LAB_0010f693;
              }
LAB_0010f6b1:
              alsa_set_stream_state(pcVar4,sVar26);
              (*pcVar4->state_callback)(pcVar4,pcVar4->user_ptr,cVar23);
            }
            else {
LAB_0010f693:
              if (sVar26 == RUNNING) {
                iVar8 = ms_since(&pcVar4->last_activity);
                sVar26 = ERROR;
                cVar23 = CUBEB_STATE_ERROR;
                if (10000 < iVar8) goto LAB_0010f6b1;
              }
            }
          }
        }
      }
    }
    else {
      if (((*(byte *)(*(long *)((long)context + 0xc0) + 6) & 1) != 0) &&
         (read(*(int *)((long)context + 0xd8),&local_41,1), *(int *)((long)context + 0xd4) != 0)) {
        pthread_mutex_unlock(__mutex_00);
        return (void *)0x0;
      }
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        pcVar4 = *(cubeb_stream_conflict1 **)((long)context + lVar11 * 8 + 0x40);
        if (((pcVar4 != (cubeb_stream_conflict1 *)0x0) && (pcVar4->state == RUNNING)) &&
           (pcVar4->fds != (pollfd *)0x0)) {
          nVar22 = 0;
          do {
            if (pcVar4->nfds == nVar22) goto LAB_0010f630;
            ppVar6 = pcVar4->fds + nVar22;
            nVar22 = nVar22 + 1;
          } while (ppVar6->revents == 0);
          alsa_set_stream_state(pcVar4,PROCESSING);
          pthread_mutex_unlock(local_40);
          __mutex = &pcVar4->mutex;
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          (*cubeb_snd_pcm_poll_descriptors_revents)
                    (pcVar4->pcm,pcVar4->fds,(uint)pcVar4->nfds,&local_32);
          uVar13 = (*cubeb_snd_pcm_avail_update)(pcVar4->pcm);
          if (uVar13 == 0) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            sVar26 = RUNNING;
          }
          else {
            uVar21 = pcVar4->buffer_size;
            if (uVar21 < (uVar13 & 0xffffffff)) {
              uVar13 = uVar21;
            }
            sVar9 = pcVar4->stream_type;
            sVar14 = uVar13;
            if ((sVar9 == SND_PCM_STREAM_CAPTURE) && (0 < (long)uVar13)) {
              sVar14 = pcVar4->bufframes;
              if (uVar21 < sVar14 + uVar13) {
                pcVar4->bufframes = 0;
                sVar14 = 0;
              }
              sVar14 = (*cubeb_snd_pcm_readi)(pcVar4->pcm,pcVar4->buffer + sVar14,uVar13);
              if (-1 < (long)sVar14) {
                pcVar4->bufframes = pcVar4->bufframes + sVar14;
                pcVar4->stream_position = pcVar4->stream_position + sVar14;
                gettimeofday((timeval *)&pcVar4->last_activity,(__timezone_ptr_t)0x0);
                sVar14 = uVar13;
              }
              sVar9 = pcVar4->stream_type;
            }
            sVar18 = sVar14;
            if ((sVar9 == SND_PCM_STREAM_CAPTURE) && (sVar16 = pcVar4->bufframes, sVar16 != 0)) {
              pcVar25 = pcVar4->other_stream;
              if (pcVar25 == (cubeb_stream_conflict1 *)0x0) {
                local_50 = (char *)0x0;
                pcVar25 = pcVar4;
              }
              else {
                uVar13 = pcVar25->bufframes;
                sVar15 = pcVar25->buffer_size - uVar13;
                if (pcVar25->buffer_size < uVar13 || sVar15 == 0) goto LAB_0010f343;
                local_50 = pcVar25->buffer + uVar13;
                if ((long)sVar15 <= (long)sVar16) {
                  sVar16 = sVar15;
                }
              }
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              sVar16 = (*pcVar4->data_callback)
                                 (pcVar25,pcVar4->user_ptr,pcVar4->buffer,local_50,sVar16);
              pthread_mutex_lock((pthread_mutex_t *)__mutex);
              sVar18 = sVar16;
              if (-1 < (long)sVar16) {
                stream_buffer_decrement(pcVar4,sVar16);
                sVar18 = sVar14;
                if (pcVar4->other_stream != (cubeb_stream_conflict1 *)0x0) {
                  psVar1 = &pcVar4->other_stream->bufframes;
                  *psVar1 = *psVar1 + sVar16;
                }
              }
            }
LAB_0010f343:
            sVar14 = sVar18;
            if (pcVar4->stream_type == SND_PCM_STREAM_PLAYBACK) {
              sVar16 = pcVar4->bufframes;
              sVar15 = sVar18 - sVar16;
              if (sVar15 != 0 && (long)sVar16 <= (long)sVar18) {
                pcVar25 = pcVar4->other_stream;
                if (pcVar25 == (cubeb_stream_conflict1 *)0x0) {
                  local_50 = (char *)0x0;
                }
                else {
                  if (pcVar25->bufframes == 0) goto LAB_0010f421;
                  local_50 = pcVar25->buffer;
                }
                pcVar5 = pcVar4->buffer;
                sVar17 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar4->pcm,sVar16);
                if ((pcVar4->other_stream != (cubeb_stream_conflict1 *)0x0) &&
                   (sVar14 = pcVar4->other_stream->bufframes, (long)sVar14 <= (long)sVar15)) {
                  sVar15 = sVar14;
                }
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                sVar16 = (*pcVar4->data_callback)
                                   (pcVar4,pcVar4->user_ptr,local_50,pcVar5 + sVar17,sVar15);
                pthread_mutex_lock((pthread_mutex_t *)__mutex);
                sVar14 = sVar16;
                if (-1 < (long)sVar16) {
                  pcVar4->bufframes = pcVar4->bufframes + sVar16;
                  sVar14 = sVar18;
                  if (pcVar4->other_stream != (cubeb_stream_conflict1 *)0x0) {
                    stream_buffer_decrement(pcVar4->other_stream,sVar16);
                  }
                }
              }
LAB_0010f421:
              if (pcVar4->stream_type != SND_PCM_STREAM_PLAYBACK) goto LAB_0010f4f6;
              sVar18 = pcVar4->bufframes;
              lVar24 = sVar14 - sVar18;
              if (lVar24 == 0 || (long)sVar14 < (long)sVar18) goto LAB_0010f4f6;
              uVar20 = (pcVar4->params).rate;
              pcVar5 = pcVar4->buffer;
              sVar17 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar4->pcm,sVar18);
              sVar27 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar4->pcm,lVar24);
              memset(pcVar5 + sVar17,0,sVar27);
              pcVar4->bufframes = sVar14;
              if ((pcVar4->other_stream == (cubeb_stream_conflict1 *)0x0) ||
                 (pcVar4->other_stream->bufframes != 0)) {
                gettimeofday((timeval *)&pcVar4->drain_timeout,(__timezone_ptr_t)0x0);
                uVar13 = (long)(((double)lVar24 / (double)uVar20) * 1000.0) & 0xffffffff;
                (pcVar4->drain_timeout).tv_sec = (pcVar4->drain_timeout).tv_sec + uVar13 / 1000;
                p_Var2 = &(pcVar4->drain_timeout).tv_usec;
                *p_Var2 = *p_Var2 + (ulong)(uint)((int)(uVar13 % 1000) * 1000);
                sVar26 = DRAINING;
              }
              else {
                sVar26 = RUNNING;
              }
            }
            else {
LAB_0010f4f6:
              sVar26 = RUNNING;
            }
            if ((pcVar4->stream_type == SND_PCM_STREAM_PLAYBACK) && (0 < (long)sVar14)) {
              uVar13 = (pcVar4->params).channels * sVar14;
              pcVar5 = pcVar4->buffer;
              if ((pcVar4->params).format == CUBEB_SAMPLE_FLOAT32LE) {
                for (uVar20 = 0; uVar21 = (ulong)uVar20, uVar21 <= uVar13 && uVar13 - uVar21 != 0;
                    uVar20 = uVar20 + 1) {
                  *(float *)(pcVar5 + uVar21 * 4) = pcVar4->volume * *(float *)(pcVar5 + uVar21 * 4)
                  ;
                }
              }
              else {
                for (uVar20 = 0; uVar21 = (ulong)uVar20, uVar21 <= uVar13 && uVar13 - uVar21 != 0;
                    uVar20 = uVar20 + 1) {
                  *(short *)(pcVar5 + uVar21 * 2) =
                       (short)(int)((float)(int)*(short *)(pcVar5 + uVar21 * 2) * pcVar4->volume);
                }
              }
              sVar18 = (*cubeb_snd_pcm_writei)(pcVar4->pcm,pcVar5,sVar14);
              if (-1 < (long)sVar18) {
                stream_buffer_decrement(pcVar4,sVar18);
                pcVar4->stream_position = pcVar4->stream_position + sVar18;
                gettimeofday((timeval *)&pcVar4->last_activity,(__timezone_ptr_t)0x0);
                goto LAB_0010f5ab;
              }
LAB_0010f5b9:
              iVar8 = (*cubeb_snd_pcm_recover)(pcVar4->pcm,(int)sVar18,0);
              if ((iVar8 < 0) ||
                 (((pcVar4->stream_type == SND_PCM_STREAM_CAPTURE &&
                   (sVar10 = (*cubeb_snd_pcm_state)(pcVar4->pcm), sVar10 == SND_PCM_STATE_PREPARED))
                  && (iVar8 = (*cubeb_snd_pcm_start)(pcVar4->pcm), iVar8 < 0)))) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                (*pcVar4->state_callback)(pcVar4,pcVar4->user_ptr,CUBEB_STATE_ERROR);
                sVar26 = ERROR;
                goto LAB_0010f61c;
              }
            }
            else {
LAB_0010f5ab:
              sVar18 = sVar14;
              if ((long)sVar14 < 0) goto LAB_0010f5b9;
            }
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
LAB_0010f61c:
          pthread_mutex_lock(local_40);
          alsa_set_stream_state(pcVar4,sVar26);
        }
LAB_0010f630:
      }
    }
    __mutex_00 = local_40;
    pthread_mutex_unlock(local_40);
  } while( true );
}

Assistant:

static void *
alsa_run_thread(void * context)
{
  cubeb * ctx = context;
  int r;

  CUBEB_REGISTER_THREAD("cubeb rendering thread");

  do {
    r = alsa_run(ctx);
  } while (r >= 0);

  CUBEB_UNREGISTER_THREAD();

  return NULL;
}